

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  GridSOA *pGVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  long lVar23;
  long lVar24;
  ulong *puVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  GridSOA *pGVar32;
  ulong uVar33;
  GridSOA *pGVar34;
  ulong uVar35;
  ulong unaff_R15;
  size_t mask;
  bool bVar36;
  byte bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  uint uVar73;
  uint uVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  ulong local_ad0;
  ulong *local_ac8;
  ulong *local_ac0;
  GridSOA *local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  RTCFilterFunctionNArguments local_a40;
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  GridSOA **local_980;
  byte local_978;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined1 local_830 [16];
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar85 = ZEXT1664(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar86 = ZEXT1664(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar87 = ZEXT1664(auVar40);
  auVar38 = vmulss_avx512f(auVar38,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar41._0_4_ = auVar38._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar38 = vmulss_avx512f(auVar39,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar73 = auVar38._0_4_;
  auVar38 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar74 = auVar38._0_4_;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = uVar31 ^ 0x10;
  auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar88 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar89 = ZEXT1664(auVar38);
  auVar38._8_4_ = 0x80000000;
  auVar38._0_8_ = 0x8000000080000000;
  auVar38._12_4_ = 0x80000000;
  auVar38 = vxorps_avx512vl(auVar41,auVar38);
  auVar90 = ZEXT1664(auVar38);
  auVar39._0_8_ = CONCAT44(uVar73,uVar73) ^ 0x8000000080000000;
  auVar39._8_4_ = uVar73 ^ 0x80000000;
  auVar39._12_4_ = uVar73 ^ 0x80000000;
  auVar40._0_8_ = CONCAT44(uVar74,uVar74) ^ 0x8000000080000000;
  auVar40._8_4_ = uVar74 ^ 0x80000000;
  auVar40._12_4_ = uVar74 ^ 0x80000000;
  local_9f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar25 = local_7f8;
  local_ad0 = uVar31;
  do {
    local_ac0 = puVar25;
    if (local_ac0 == &local_800) break;
    local_ac8 = local_ac0 + -1;
    uVar29 = local_ac0[-1];
    do {
      local_a80 = auVar88._0_16_;
      local_a90 = auVar89._0_16_;
      local_a50 = auVar85._0_16_;
      local_a60 = auVar86._0_16_;
      local_a70 = auVar87._0_16_;
      local_aa0 = auVar90._0_16_;
      if ((uVar29 & 8) == 0) {
        uVar26 = uVar29 & 0xfffffffffffffff0;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar72._4_4_ = uVar7;
        auVar72._0_4_ = uVar7;
        auVar72._8_4_ = uVar7;
        auVar72._12_4_ = uVar7;
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar31),auVar72,
                                  *(undefined1 (*) [16])(uVar26 + 0x20 + uVar31));
        auVar41 = vfmadd213ps_avx512vl(auVar38,local_a50,local_aa0);
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar33),auVar72,
                                  *(undefined1 (*) [16])(uVar26 + 0x20 + uVar33));
        auVar42 = vmaxps_avx512vl(local_a80,auVar41);
        auVar41 = vfmadd213ps_avx512vl(auVar38,local_a60,auVar39);
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar28),auVar72,
                                  *(undefined1 (*) [16])(uVar26 + 0x20 + uVar28));
        auVar38 = vfmadd213ps_avx512vl(auVar38,local_a70,auVar40);
        auVar38 = vmaxps_avx(auVar41,auVar38);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar35),auVar72,
                                  *(undefined1 (*) [16])(uVar26 + 0x20 + uVar35));
        auVar38 = vmaxps_avx(auVar42,auVar38);
        auVar42 = vfmadd213ps_avx512vl(auVar41,local_a50,local_aa0);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + (uVar33 ^ 0x10)),auVar72,
                                  *(undefined1 (*) [16])(uVar26 + 0x20 + (uVar33 ^ 0x10)));
        auVar42 = vminps_avx512vl(local_a90,auVar42);
        auVar43 = vfmadd213ps_avx512vl(auVar41,local_a60,auVar39);
        auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + (uVar28 ^ 0x10)),auVar72,
                                  *(undefined1 (*) [16])(uVar26 + 0x20 + (uVar28 ^ 0x10)));
        auVar41 = vfmadd213ps_avx512vl(auVar41,local_a70,auVar40);
        auVar41 = vminps_avx(auVar43,auVar41);
        auVar41 = vminps_avx(auVar42,auVar41);
        uVar20 = vcmpps_avx512vl(auVar38,auVar41,2);
        bVar37 = (byte)uVar20;
        if (((uint)uVar29 & 7) == 6) {
          uVar20 = vcmpps_avx512vl(auVar72,*(undefined1 (*) [16])(uVar26 + 0xf0),1);
          uVar21 = vcmpps_avx512vl(auVar72,*(undefined1 (*) [16])(uVar26 + 0xe0),0xd);
          bVar37 = (byte)uVar20 & (byte)uVar21 & bVar37;
        }
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar37);
      }
      if ((uVar29 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar73 = 4;
        }
        else {
          uVar26 = uVar29 & 0xfffffffffffffff0;
          lVar27 = 0;
          for (uVar29 = unaff_R15; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar73 = 0;
          for (uVar30 = unaff_R15 - 1 & unaff_R15; uVar29 = *(ulong *)(uVar26 + lVar27 * 8),
              uVar30 != 0; uVar30 = uVar30 - 1 & uVar30) {
            *local_ac8 = uVar29;
            local_ac8 = local_ac8 + 1;
            lVar27 = 0;
            for (uVar29 = uVar30; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
          }
        }
      }
      else {
        uVar73 = 6;
      }
    } while (uVar73 == 0);
    if (uVar73 == 6) {
      if (((uint)uVar29 & 0xf) == 8) {
        pGVar15 = (pre->super_Precalculations).grid;
        uVar73 = *(uint *)(pGVar15 + 0xc);
        local_ab0 = (ulong)uVar73;
        auVar41 = vcvtusi2ss_avx512f(in_ZMM16._0_16_,*(int *)(pGVar15 + 8) + -1);
        fVar19 = auVar41._0_4_ * *(float *)(ray + k * 4 + 0x70);
        auVar38 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),9);
        auVar38 = vminss_avx(auVar38,ZEXT416((uint)(auVar41._0_4_ + -1.0)));
        auVar42 = vmaxss_avx(ZEXT816(0) << 0x20,auVar38);
        uVar74 = *(uint *)(pGVar15 + 0x10);
        local_aa8 = (ulong)uVar74;
        lVar27 = (long)(int)auVar42._0_4_ * (ulong)*(uint *)(pGVar15 + 0x28) +
                 (ulong)*(uint *)(pGVar15 + 0x24);
        uVar29 = uVar29 >> 4;
        lVar23 = uVar29 * 4 + lVar27;
        lVar24 = uVar29 * 4 + lVar27 + 0x2c;
        auVar38 = *(undefined1 (*) [16])(pGVar15 + local_ab0 * 4 + lVar23 + 0x2c);
        auVar41 = auVar38;
        if (2 < local_aa8) {
          auVar41 = *(undefined1 (*) [16])(pGVar15 + local_ab0 * 8 + lVar24);
        }
        auVar43 = *(undefined1 (*) [16])(pGVar15 + uVar29 * 4 + lVar27 + 0x2c);
        if (local_ab0 == 2) {
          auVar43 = vshufps_avx(auVar43,auVar43,0x54);
          auVar38 = vshufps_avx(auVar38,auVar38,0x54);
          auVar41 = vshufps_avx(auVar41,auVar41,0x54);
        }
        uVar31 = (ulong)*(uint *)(pGVar15 + 0x14);
        pGVar32 = pGVar15 + uVar31 * 4 + lVar23 + 0x2c;
        auVar72 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 4);
        auVar44 = auVar72;
        if (2 < uVar74) {
          auVar44 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 8);
        }
        auVar9 = *(undefined1 (*) [16])pGVar32;
        if (uVar73 == 2) {
          auVar9 = vshufps_avx(auVar9,auVar9,0x54);
          auVar72 = vshufps_avx(auVar72,auVar72,0x54);
          auVar44 = vshufps_avx(auVar44,auVar44,0x54);
        }
        pGVar34 = pGVar15 + uVar31 * 8 + lVar23 + 0x2c;
        auVar10 = *(undefined1 (*) [16])(pGVar34 + local_ab0 * 4);
        auVar82 = auVar10;
        if (2 < uVar74) {
          auVar82 = *(undefined1 (*) [16])(pGVar34 + local_ab0 * 8);
        }
        auVar11 = *(undefined1 (*) [16])pGVar34;
        if (uVar73 == 2) {
          auVar11 = vshufps_avx(auVar11,auVar11,0x54);
          auVar10 = vshufps_avx(auVar10,auVar10,0x54);
          auVar82 = vshufps_avx(auVar82,auVar82,0x54);
        }
        uVar29 = (ulong)(*(uint *)(pGVar15 + 0x28) & 0xfffffffc);
        auVar12 = *(undefined1 (*) [16])(pGVar15 + local_ab0 * 4 + uVar29 + lVar24);
        auVar83 = auVar12;
        if (2 < uVar74) {
          auVar83 = *(undefined1 (*) [16])(pGVar15 + local_ab0 * 8 + uVar29 + lVar24);
        }
        auVar13 = *(undefined1 (*) [16])(pGVar15 + uVar29 + lVar24);
        if (uVar73 == 2) {
          auVar13 = vshufps_avx(auVar13,auVar13,0x54);
          auVar12 = vshufps_avx(auVar12,auVar12,0x54);
          auVar83 = vshufps_avx(auVar83,auVar83,0x54);
        }
        pGVar32 = pGVar32 + uVar29;
        auVar14 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 4);
        auVar84 = auVar14;
        if (2 < uVar74) {
          auVar84 = *(undefined1 (*) [16])(pGVar32 + local_ab0 * 8);
        }
        auVar45 = *(undefined1 (*) [16])pGVar32;
        if (uVar73 == 2) {
          auVar45 = vshufps_avx512vl(auVar45,auVar45,0x54);
          auVar14 = vshufps_avx(auVar14,auVar14,0x54);
          auVar84 = vshufps_avx(auVar84,auVar84,0x54);
        }
        pGVar34 = pGVar34 + uVar29;
        auVar46 = *(undefined1 (*) [16])pGVar34;
        auVar47 = *(undefined1 (*) [16])(pGVar34 + local_ab0 * 4);
        auVar48 = auVar47;
        if (2 < uVar74) {
          auVar48 = *(undefined1 (*) [16])(pGVar34 + local_ab0 * 8);
        }
        if (uVar73 == 2) {
          auVar46 = vshufps_avx512vl(auVar46,auVar46,0x54);
          auVar47 = vshufps_avx512vl(auVar47,auVar47,0x54);
          auVar48 = vshufps_avx512vl(auVar48,auVar48,0x54);
        }
        local_ab8 = pGVar15 + uVar31 * 0xc + lVar23 + 0x2c;
        auVar59._16_16_ = auVar38;
        auVar59._0_16_ = auVar43;
        auVar63._16_16_ = auVar41;
        auVar63._0_16_ = auVar38;
        auVar56 = vunpcklps_avx(auVar59,auVar63);
        auVar59 = vshufps_avx(auVar59,auVar59,0xa5);
        auVar62 = vshufps_avx(auVar63,auVar63,0x94);
        auVar57._16_16_ = auVar72;
        auVar57._0_16_ = auVar9;
        auVar64._16_16_ = auVar44;
        auVar64._0_16_ = auVar72;
        auVar58 = vunpcklps_avx(auVar57,auVar64);
        auVar60 = vshufps_avx(auVar57,auVar57,0xa5);
        auVar69 = vshufps_avx(auVar64,auVar64,0x94);
        auVar49._16_16_ = auVar10;
        auVar49._0_16_ = auVar11;
        auVar65._16_16_ = auVar82;
        auVar65._0_16_ = auVar10;
        auVar66 = vunpcklps_avx(auVar49,auVar65);
        auVar61 = vshufps_avx(auVar49,auVar49,0xa5);
        auVar63 = vshufps_avx(auVar65,auVar65,0x94);
        auVar55._16_16_ = auVar12;
        auVar55._0_16_ = auVar13;
        auVar50._16_16_ = auVar83;
        auVar50._0_16_ = auVar12;
        auVar54 = vunpcklps_avx(auVar55,auVar50);
        auVar57 = vshufps_avx(auVar55,auVar55,0xa5);
        auVar64 = vshufps_avx(auVar50,auVar50,0x94);
        auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar14,1);
        auVar51._16_16_ = auVar84;
        auVar51._0_16_ = auVar14;
        auVar55 = vunpcklps_avx(auVar49,auVar51);
        auVar49 = vshufps_avx(auVar49,auVar49,0xa5);
        auVar65 = vshufps_avx(auVar51,auVar51,0x94);
        auVar50 = vinsertf32x4_avx512vl(ZEXT1632(auVar46),auVar47,1);
        auVar51 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar48,1);
        auVar52 = vunpcklps_avx512vl(auVar50,auVar51);
        auVar50 = vshufps_avx512vl(auVar50,auVar50,0xa5);
        auVar51 = vshufps_avx512vl(auVar51,auVar51,0x94);
        auVar38 = ZEXT416((uint)(fVar19 - auVar42._0_4_));
        auVar53 = vbroadcastss_avx512vl(auVar38);
        auVar38 = vsubss_avx512f(ZEXT416(0x3f800000),auVar38);
        auVar67._0_4_ = auVar38._0_4_;
        auVar67._4_4_ = auVar67._0_4_;
        auVar67._8_4_ = auVar67._0_4_;
        auVar67._12_4_ = auVar67._0_4_;
        auVar67._16_4_ = auVar67._0_4_;
        auVar67._20_4_ = auVar67._0_4_;
        auVar67._24_4_ = auVar67._0_4_;
        auVar67._28_4_ = auVar67._0_4_;
        auVar54 = vmulps_avx512vl(auVar53,auVar54);
        auVar55 = vmulps_avx512vl(auVar53,auVar55);
        auVar52 = vmulps_avx512vl(auVar53,auVar52);
        auVar38 = vfmadd231ps_fma(auVar54,auVar67,auVar56);
        auVar41 = vfmadd231ps_fma(auVar55,auVar67,auVar58);
        auVar56 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar66);
        auVar57 = vmulps_avx512vl(auVar53,auVar57);
        auVar49 = vmulps_avx512vl(auVar53,auVar49);
        auVar58 = vmulps_avx512vl(auVar53,auVar50);
        auVar42 = vfmadd231ps_fma(auVar57,auVar67,auVar59);
        auVar43 = vfmadd231ps_fma(auVar49,auVar67,auVar60);
        auVar72 = vfmadd231ps_fma(auVar58,auVar67,auVar61);
        auVar59 = vmulps_avx512vl(auVar53,auVar64);
        auVar60 = vmulps_avx512vl(auVar53,auVar65);
        auVar61 = vmulps_avx512vl(auVar53,auVar51);
        auVar44 = vfmadd231ps_fma(auVar59,auVar67,auVar62);
        auVar9 = vfmadd231ps_fma(auVar60,auVar67,auVar69);
        uVar7 = *(undefined4 *)(ray + k * 4);
        auVar58._4_4_ = uVar7;
        auVar58._0_4_ = uVar7;
        auVar58._8_4_ = uVar7;
        auVar58._12_4_ = uVar7;
        auVar58._16_4_ = uVar7;
        auVar58._20_4_ = uVar7;
        auVar58._24_4_ = uVar7;
        auVar58._28_4_ = uVar7;
        auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar77._4_4_ = uVar7;
        auVar77._0_4_ = uVar7;
        auVar77._8_4_ = uVar7;
        auVar77._12_4_ = uVar7;
        auVar77._16_4_ = uVar7;
        auVar77._20_4_ = uVar7;
        auVar77._24_4_ = uVar7;
        auVar77._28_4_ = uVar7;
        auVar10 = vfmadd231ps_fma(auVar61,auVar67,auVar63);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar79._4_4_ = uVar7;
        auVar79._0_4_ = uVar7;
        auVar79._8_4_ = uVar7;
        auVar79._12_4_ = uVar7;
        auVar79._16_4_ = uVar7;
        auVar79._20_4_ = uVar7;
        auVar79._24_4_ = uVar7;
        auVar79._28_4_ = uVar7;
        fVar19 = *(float *)(ray + k * 4 + 0x60);
        auVar81._4_4_ = fVar19;
        auVar81._0_4_ = fVar19;
        auVar81._8_4_ = fVar19;
        auVar81._12_4_ = fVar19;
        auVar81._16_4_ = fVar19;
        auVar81._20_4_ = fVar19;
        auVar81._24_4_ = fVar19;
        auVar81._28_4_ = fVar19;
        auVar59 = vsubps_avx(ZEXT1632(auVar38),auVar58);
        auVar63 = vsubps_avx512vl(ZEXT1632(auVar41),auVar62);
        auVar57 = vsubps_avx512vl(auVar56,auVar60);
        auVar64 = vsubps_avx512vl(ZEXT1632(auVar42),auVar58);
        auVar49 = vsubps_avx512vl(ZEXT1632(auVar43),auVar62);
        auVar65 = vsubps_avx512vl(ZEXT1632(auVar72),auVar60);
        auVar56 = vsubps_avx512vl(ZEXT1632(auVar44),auVar58);
        auVar62 = vsubps_avx512vl(ZEXT1632(auVar9),auVar62);
        auVar60 = vsubps_avx512vl(ZEXT1632(auVar10),auVar60);
        auVar58 = vsubps_avx512vl(auVar56,auVar59);
        auVar66 = vsubps_avx512vl(auVar62,auVar63);
        auVar54 = vsubps_avx512vl(auVar60,auVar57);
        auVar55 = vsubps_avx512vl(auVar59,auVar64);
        auVar50 = vsubps_avx512vl(auVar63,auVar49);
        in_ZMM16 = ZEXT3264(auVar50);
        auVar51 = vsubps_avx512vl(auVar57,auVar65);
        auVar52 = vsubps_avx512vl(auVar64,auVar56);
        auVar53 = vsubps_avx512vl(auVar49,auVar62);
        auVar67 = vsubps_avx512vl(auVar65,auVar60);
        auVar61 = vaddps_avx512vl(auVar56,auVar59);
        auVar68 = vaddps_avx512vl(auVar62,auVar63);
        auVar69 = vaddps_avx512vl(auVar60,auVar57);
        auVar70 = vmulps_avx512vl(auVar68,auVar54);
        auVar70 = vfmsub231ps_avx512vl(auVar70,auVar66,auVar69);
        auVar69 = vmulps_avx512vl(auVar69,auVar58);
        auVar71 = vfmsub231ps_avx512vl(auVar69,auVar54,auVar61);
        auVar69._4_4_ = auVar61._4_4_ * auVar66._4_4_;
        auVar69._0_4_ = auVar61._0_4_ * auVar66._0_4_;
        auVar69._8_4_ = auVar61._8_4_ * auVar66._8_4_;
        auVar69._12_4_ = auVar61._12_4_ * auVar66._12_4_;
        auVar69._16_4_ = auVar61._16_4_ * auVar66._16_4_;
        auVar69._20_4_ = auVar61._20_4_ * auVar66._20_4_;
        auVar69._24_4_ = auVar61._24_4_ * auVar66._24_4_;
        auVar69._28_4_ = auVar61._28_4_;
        auVar38 = vfmsub231ps_fma(auVar69,auVar58,auVar68);
        auVar68._0_4_ = auVar38._0_4_ * fVar19;
        auVar68._4_4_ = auVar38._4_4_ * fVar19;
        auVar68._8_4_ = auVar38._8_4_ * fVar19;
        auVar68._12_4_ = auVar38._12_4_ * fVar19;
        auVar68._16_4_ = fVar19 * 0.0;
        auVar68._20_4_ = fVar19 * 0.0;
        auVar68._24_4_ = fVar19 * 0.0;
        auVar68._28_4_ = 0;
        auVar69 = vfmadd231ps_avx512vl(auVar68,auVar79,auVar71);
        _local_9e0 = vfmadd231ps_avx512vl(auVar69,auVar77,auVar70);
        auVar69 = vaddps_avx512vl(auVar59,auVar64);
        auVar61 = vaddps_avx512vl(auVar63,auVar49);
        auVar68 = vaddps_avx512vl(auVar57,auVar65);
        auVar70 = vmulps_avx512vl(auVar61,auVar51);
        auVar70 = vfmsub231ps_avx512vl(auVar70,auVar50,auVar68);
        auVar68 = vmulps_avx512vl(auVar68,auVar55);
        auVar68 = vfmsub231ps_avx512vl(auVar68,auVar51,auVar69);
        auVar69 = vmulps_avx512vl(auVar69,auVar50);
        auVar69 = vfmsub231ps_avx512vl(auVar69,auVar55,auVar61);
        auVar61._4_4_ = auVar69._4_4_ * fVar19;
        auVar61._0_4_ = auVar69._0_4_ * fVar19;
        auVar61._8_4_ = auVar69._8_4_ * fVar19;
        auVar61._12_4_ = auVar69._12_4_ * fVar19;
        auVar61._16_4_ = auVar69._16_4_ * fVar19;
        auVar61._20_4_ = auVar69._20_4_ * fVar19;
        auVar61._24_4_ = auVar69._24_4_ * fVar19;
        auVar61._28_4_ = auVar69._28_4_;
        auVar69 = vfmadd231ps_avx512vl(auVar61,auVar79,auVar68);
        _local_9c0 = vfmadd231ps_avx512vl(auVar69,auVar77,auVar70);
        auVar69 = vaddps_avx512vl(auVar64,auVar56);
        auVar62 = vaddps_avx512vl(auVar49,auVar62);
        auVar60 = vaddps_avx512vl(auVar65,auVar60);
        auVar61 = vmulps_avx512vl(auVar62,auVar67);
        auVar61 = vfmsub231ps_avx512vl(auVar61,auVar53,auVar60);
        auVar60 = vmulps_avx512vl(auVar60,auVar52);
        auVar60 = vfmsub231ps_avx512vl(auVar60,auVar67,auVar69);
        auVar69 = vmulps_avx512vl(auVar69,auVar53);
        auVar62 = vfmsub231ps_avx512vl(auVar69,auVar52,auVar62);
        auVar62 = vmulps_avx512vl(auVar62,auVar81);
        auVar62 = vfmadd231ps_avx512vl(auVar62,auVar79,auVar60);
        auVar69 = vfmadd231ps_avx512vl(auVar62,auVar77,auVar61);
        auVar62 = vaddps_avx512vl(_local_9e0,_local_9c0);
        local_9a0 = vaddps_avx512vl(auVar69,auVar62);
        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(local_9a0,auVar61);
        auVar62._8_4_ = 0x34000000;
        auVar62._0_8_ = 0x3400000034000000;
        auVar62._12_4_ = 0x34000000;
        auVar62._16_4_ = 0x34000000;
        auVar62._20_4_ = 0x34000000;
        auVar62._24_4_ = 0x34000000;
        auVar62._28_4_ = 0x34000000;
        auVar62 = vmulps_avx512vl(auVar61,auVar62);
        auVar60 = vminps_avx512vl(_local_9e0,_local_9c0);
        auVar64 = vminps_avx512vl(auVar60,auVar69);
        auVar60._8_4_ = 0x80000000;
        auVar60._0_8_ = 0x8000000080000000;
        auVar60._12_4_ = 0x80000000;
        auVar60._16_4_ = 0x80000000;
        auVar60._20_4_ = 0x80000000;
        auVar60._24_4_ = 0x80000000;
        auVar60._28_4_ = 0x80000000;
        auVar60 = vxorps_avx512vl(auVar62,auVar60);
        uVar20 = vcmpps_avx512vl(auVar64,auVar60,5);
        auVar60 = vmaxps_avx512vl(_local_9e0,_local_9c0);
        auVar60 = vmaxps_avx512vl(auVar60,auVar69);
        uVar21 = vcmpps_avx512vl(auVar60,auVar62,2);
        local_978 = (byte)uVar20 | (byte)uVar21;
        if (local_978 == 0) {
LAB_0078db6d:
          bVar36 = false;
        }
        else {
          auVar62 = vmulps_avx512vl(auVar50,auVar54);
          auVar60 = vmulps_avx512vl(auVar58,auVar51);
          auVar69 = vmulps_avx512vl(auVar55,auVar66);
          auVar64 = vmulps_avx512vl(auVar53,auVar51);
          auVar49 = vmulps_avx512vl(auVar55,auVar67);
          auVar65 = vmulps_avx512vl(auVar52,auVar50);
          auVar56 = vfmsub213ps_avx512vl(auVar66,auVar51,auVar62);
          auVar66 = vfmsub213ps_avx512vl(auVar54,auVar55,auVar60);
          auVar58 = vfmsub213ps_avx512vl(auVar58,auVar50,auVar69);
          auVar54 = vfmsub213ps_avx512vl(auVar67,auVar50,auVar64);
          auVar50 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar49);
          auVar55 = vfmsub213ps_avx512vl(auVar53,auVar55,auVar65);
          vandps_avx512vl(auVar62,auVar61);
          vandps_avx512vl(auVar64,auVar61);
          uVar31 = vcmpps_avx512vl(auVar55,auVar55,1);
          vandps_avx512vl(auVar60,auVar61);
          vandps_avx512vl(auVar49,auVar61);
          uVar29 = vcmpps_avx512vl(auVar55,auVar55,1);
          vandps_avx512vl(auVar69,auVar61);
          vandps_avx512vl(auVar65,auVar61);
          uVar26 = vcmpps_avx512vl(auVar55,auVar55,1);
          bVar36 = (bool)((byte)uVar31 & 1);
          local_900._0_4_ = (uint)bVar36 * auVar56._0_4_ | (uint)!bVar36 * auVar54._0_4_;
          bVar36 = (bool)((byte)(uVar31 >> 1) & 1);
          local_900._4_4_ = (uint)bVar36 * auVar56._4_4_ | (uint)!bVar36 * auVar54._4_4_;
          bVar36 = (bool)((byte)(uVar31 >> 2) & 1);
          local_900._8_4_ = (uint)bVar36 * auVar56._8_4_ | (uint)!bVar36 * auVar54._8_4_;
          bVar36 = (bool)((byte)(uVar31 >> 3) & 1);
          local_900._12_4_ = (uint)bVar36 * auVar56._12_4_ | (uint)!bVar36 * auVar54._12_4_;
          bVar36 = (bool)((byte)(uVar31 >> 4) & 1);
          local_900._16_4_ = (uint)bVar36 * auVar56._16_4_ | (uint)!bVar36 * auVar54._16_4_;
          bVar36 = (bool)((byte)(uVar31 >> 5) & 1);
          local_900._20_4_ = (uint)bVar36 * auVar56._20_4_ | (uint)!bVar36 * auVar54._20_4_;
          bVar36 = (bool)((byte)(uVar31 >> 6) & 1);
          local_900._24_4_ = (uint)bVar36 * auVar56._24_4_ | (uint)!bVar36 * auVar54._24_4_;
          bVar36 = SUB81(uVar31 >> 7,0);
          local_900._28_4_ = (uint)bVar36 * auVar56._28_4_ | (uint)!bVar36 * auVar54._28_4_;
          bVar36 = (bool)((byte)uVar29 & 1);
          local_8e0._0_4_ = (uint)bVar36 * auVar66._0_4_ | (uint)!bVar36 * auVar50._0_4_;
          bVar36 = (bool)((byte)(uVar29 >> 1) & 1);
          local_8e0._4_4_ = (uint)bVar36 * auVar66._4_4_ | (uint)!bVar36 * auVar50._4_4_;
          bVar36 = (bool)((byte)(uVar29 >> 2) & 1);
          local_8e0._8_4_ = (uint)bVar36 * auVar66._8_4_ | (uint)!bVar36 * auVar50._8_4_;
          bVar36 = (bool)((byte)(uVar29 >> 3) & 1);
          local_8e0._12_4_ = (uint)bVar36 * auVar66._12_4_ | (uint)!bVar36 * auVar50._12_4_;
          bVar36 = (bool)((byte)(uVar29 >> 4) & 1);
          local_8e0._16_4_ = (uint)bVar36 * auVar66._16_4_ | (uint)!bVar36 * auVar50._16_4_;
          bVar36 = (bool)((byte)(uVar29 >> 5) & 1);
          local_8e0._20_4_ = (uint)bVar36 * auVar66._20_4_ | (uint)!bVar36 * auVar50._20_4_;
          bVar36 = (bool)((byte)(uVar29 >> 6) & 1);
          local_8e0._24_4_ = (uint)bVar36 * auVar66._24_4_ | (uint)!bVar36 * auVar50._24_4_;
          bVar36 = SUB81(uVar29 >> 7,0);
          local_8e0._28_4_ = (uint)bVar36 * auVar66._28_4_ | (uint)!bVar36 * auVar50._28_4_;
          bVar36 = (bool)((byte)uVar26 & 1);
          local_8c0._0_4_ = (float)((uint)bVar36 * auVar58._0_4_ | (uint)!bVar36 * auVar55._0_4_);
          bVar36 = (bool)((byte)(uVar26 >> 1) & 1);
          local_8c0._4_4_ = (float)((uint)bVar36 * auVar58._4_4_ | (uint)!bVar36 * auVar55._4_4_);
          bVar36 = (bool)((byte)(uVar26 >> 2) & 1);
          local_8c0._8_4_ = (float)((uint)bVar36 * auVar58._8_4_ | (uint)!bVar36 * auVar55._8_4_);
          bVar36 = (bool)((byte)(uVar26 >> 3) & 1);
          local_8c0._12_4_ = (float)((uint)bVar36 * auVar58._12_4_ | (uint)!bVar36 * auVar55._12_4_)
          ;
          bVar36 = (bool)((byte)(uVar26 >> 4) & 1);
          local_8c0._16_4_ = (float)((uint)bVar36 * auVar58._16_4_ | (uint)!bVar36 * auVar55._16_4_)
          ;
          bVar36 = (bool)((byte)(uVar26 >> 5) & 1);
          local_8c0._20_4_ = (float)((uint)bVar36 * auVar58._20_4_ | (uint)!bVar36 * auVar55._20_4_)
          ;
          bVar36 = (bool)((byte)(uVar26 >> 6) & 1);
          local_8c0._24_4_ = (float)((uint)bVar36 * auVar58._24_4_ | (uint)!bVar36 * auVar55._24_4_)
          ;
          bVar36 = SUB81(uVar26 >> 7,0);
          local_8c0._28_4_ = (uint)bVar36 * auVar58._28_4_ | (uint)!bVar36 * auVar55._28_4_;
          auVar52._4_4_ = fVar19 * local_8c0._4_4_;
          auVar52._0_4_ = fVar19 * local_8c0._0_4_;
          auVar52._8_4_ = fVar19 * local_8c0._8_4_;
          auVar52._12_4_ = fVar19 * local_8c0._12_4_;
          auVar52._16_4_ = fVar19 * local_8c0._16_4_;
          auVar52._20_4_ = fVar19 * local_8c0._20_4_;
          auVar52._24_4_ = fVar19 * local_8c0._24_4_;
          auVar52._28_4_ = fVar19;
          auVar38 = vfmadd213ps_fma(auVar79,local_8e0,auVar52);
          auVar38 = vfmadd213ps_fma(auVar77,local_900,ZEXT1632(auVar38));
          auVar60 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                       CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                                CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                         auVar38._0_4_ + auVar38._0_4_))));
          auVar53._0_4_ = auVar57._0_4_ * local_8c0._0_4_;
          auVar53._4_4_ = auVar57._4_4_ * local_8c0._4_4_;
          auVar53._8_4_ = auVar57._8_4_ * local_8c0._8_4_;
          auVar53._12_4_ = auVar57._12_4_ * local_8c0._12_4_;
          auVar53._16_4_ = auVar57._16_4_ * local_8c0._16_4_;
          auVar53._20_4_ = auVar57._20_4_ * local_8c0._20_4_;
          auVar53._24_4_ = auVar57._24_4_ * local_8c0._24_4_;
          auVar53._28_4_ = 0;
          auVar38 = vfmadd213ps_fma(auVar63,local_8e0,auVar53);
          auVar41 = vfmadd213ps_fma(auVar59,local_900,ZEXT1632(auVar38));
          auVar59 = vrcp14ps_avx512vl(auVar60);
          auVar56._8_4_ = 0x3f800000;
          auVar56._0_8_ = &DAT_3f8000003f800000;
          auVar56._12_4_ = 0x3f800000;
          auVar56._16_4_ = 0x3f800000;
          auVar56._20_4_ = 0x3f800000;
          auVar56._24_4_ = 0x3f800000;
          auVar56._28_4_ = 0x3f800000;
          auVar62 = vfnmadd213ps_avx512vl(auVar59,auVar60,auVar56);
          auVar38 = vfmadd132ps_fma(auVar62,auVar59,auVar59);
          local_920 = ZEXT1632(CONCAT412((auVar41._12_4_ + auVar41._12_4_) * auVar38._12_4_,
                                         CONCAT48((auVar41._8_4_ + auVar41._8_4_) * auVar38._8_4_,
                                                  CONCAT44((auVar41._4_4_ + auVar41._4_4_) *
                                                           auVar38._4_4_,
                                                           (auVar41._0_4_ + auVar41._0_4_) *
                                                           auVar38._0_4_))));
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar66._4_4_ = uVar7;
          auVar66._0_4_ = uVar7;
          auVar66._8_4_ = uVar7;
          auVar66._12_4_ = uVar7;
          auVar66._16_4_ = uVar7;
          auVar66._20_4_ = uVar7;
          auVar66._24_4_ = uVar7;
          auVar66._28_4_ = uVar7;
          uVar20 = vcmpps_avx512vl(local_920,auVar66,0xd);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar54._4_4_ = uVar7;
          auVar54._0_4_ = uVar7;
          auVar54._8_4_ = uVar7;
          auVar54._12_4_ = uVar7;
          auVar54._16_4_ = uVar7;
          auVar54._20_4_ = uVar7;
          auVar54._24_4_ = uVar7;
          auVar54._28_4_ = uVar7;
          uVar21 = vcmpps_avx512vl(local_920,auVar54,2);
          local_978 = (byte)uVar20 & (byte)uVar21 & local_978;
          if (local_978 == 0) goto LAB_0078db6d;
          uVar20 = vcmpps_avx512vl(auVar60,ZEXT832(0) << 0x20,4);
          local_978 = local_978 & (byte)uVar20;
          if (local_978 == 0) goto LAB_0078db6d;
          local_980 = &local_ab8;
          pGVar16 = (context->scene->geometries).items[*(uint *)(pGVar15 + 0x18)].ptr;
          if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0078db6d;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar36 = true, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            vandps_avx512vl(local_9a0,auVar61);
            auVar70._8_4_ = 0x219392ef;
            auVar70._0_8_ = 0x219392ef219392ef;
            auVar70._12_4_ = 0x219392ef;
            auVar70._16_4_ = 0x219392ef;
            auVar70._20_4_ = 0x219392ef;
            auVar70._24_4_ = 0x219392ef;
            auVar70._28_4_ = 0x219392ef;
            uVar31 = vcmpps_avx512vl(local_9a0,auVar70,5);
            auVar59 = vrcp14ps_avx512vl(local_9a0);
            auVar75._8_4_ = 0x3f800000;
            auVar75._0_8_ = &DAT_3f8000003f800000;
            auVar75._12_4_ = 0x3f800000;
            auVar75._16_4_ = 0x3f800000;
            auVar75._20_4_ = 0x3f800000;
            auVar75._24_4_ = 0x3f800000;
            auVar75._28_4_ = 0x3f800000;
            auVar38 = vfnmadd213ps_fma(local_9a0,auVar59,auVar75);
            auVar62 = vfmadd132ps_avx512vl(ZEXT1632(auVar38),auVar59,auVar59);
            fVar1 = (float)((uint)((byte)uVar31 & 1) * auVar62._0_4_);
            fVar2 = (float)((uint)((byte)(uVar31 >> 1) & 1) * auVar62._4_4_);
            fVar3 = (float)((uint)((byte)(uVar31 >> 2) & 1) * auVar62._8_4_);
            fVar4 = (float)((uint)((byte)(uVar31 >> 3) & 1) * auVar62._12_4_);
            fVar5 = (float)((uint)((byte)(uVar31 >> 4) & 1) * auVar62._16_4_);
            fVar6 = (float)((uint)((byte)(uVar31 >> 5) & 1) * auVar62._20_4_);
            fVar19 = (float)((uint)((byte)(uVar31 >> 6) & 1) * auVar62._24_4_);
            auVar71._4_4_ = fVar2 * (float)local_9e0._4_4_;
            auVar71._0_4_ = fVar1 * (float)local_9e0._0_4_;
            auVar71._8_4_ = fVar3 * fStack_9d8;
            auVar71._12_4_ = fVar4 * fStack_9d4;
            auVar71._16_4_ = fVar5 * fStack_9d0;
            auVar71._20_4_ = fVar6 * fStack_9cc;
            auVar71._24_4_ = fVar19 * fStack_9c8;
            auVar71._28_4_ = auVar59._28_4_;
            auVar59 = vminps_avx(auVar71,auVar75);
            auVar22._4_4_ = fVar2 * (float)local_9c0._4_4_;
            auVar22._0_4_ = fVar1 * (float)local_9c0._0_4_;
            auVar22._8_4_ = fVar3 * fStack_9b8;
            auVar22._12_4_ = fVar4 * fStack_9b4;
            auVar22._16_4_ = fVar5 * fStack_9b0;
            auVar22._20_4_ = fVar6 * fStack_9ac;
            auVar22._24_4_ = fVar19 * fStack_9a8;
            auVar22._28_4_ = (uint)(byte)(uVar31 >> 7) * auVar62._28_4_;
            auVar62 = vminps_avx(auVar22,auVar75);
            auVar38 = *(undefined1 (*) [16])(local_ab8 + local_ab0 * 4);
            auVar41 = auVar38;
            if (2 < local_aa8) {
              auVar41 = *(undefined1 (*) [16])(local_ab8 + local_ab0 * 8);
            }
            auVar42 = *(undefined1 (*) [16])local_ab8;
            if (local_ab0 == 2) {
              auVar42 = vpshufd_avx(auVar42,0x54);
              auVar38 = vpshufd_avx(auVar38,0x54);
              auVar41 = vpshufd_avx(auVar41,0x54);
            }
            auVar78._0_16_ = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar42;
            auVar78._16_16_ = ZEXT116(1) * auVar38;
            auVar76._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar38;
            auVar76._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
            auVar60 = vpunpckldq_avx2(auVar78,auVar76);
            auVar61 = vpshufd_avx2(auVar78,0xa5);
            auVar57 = vpshufd_avx2(auVar76,0x94);
            auVar69 = vpsrld_avx2(auVar60,0x10);
            auVar60 = vpblendw_avx2(auVar60,ZEXT832(0) << 0x20,0xaa);
            auVar60 = vcvtdq2ps_avx(auVar60);
            auVar69 = vcvtdq2ps_avx(auVar69);
            auVar63 = vpsrld_avx2(auVar61,0x10);
            auVar61 = vpblendw_avx2(auVar61,ZEXT832(0) << 0x20,0xaa);
            auVar61 = vcvtdq2ps_avx(auVar61);
            auVar63 = vcvtdq2ps_avx(auVar63);
            auVar64 = vpsrld_avx2(auVar57,0x10);
            auVar57 = vpblendw_avx2(auVar57,ZEXT832(0) << 0x20,0xaa);
            auVar57 = vcvtdq2ps_avx(auVar57);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = &DAT_3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar80._16_4_ = 0x3f800000;
            auVar80._20_4_ = 0x3f800000;
            auVar80._24_4_ = 0x3f800000;
            auVar80._28_4_ = 0x3f800000;
            auVar49 = vsubps_avx(auVar80,auVar59);
            auVar49 = vsubps_avx(auVar49,auVar62);
            local_960._0_4_ =
                 auVar62._0_4_ * auVar57._0_4_ * 0.00012207031 +
                 auVar59._0_4_ * auVar61._0_4_ * 0.00012207031 +
                 auVar49._0_4_ * auVar60._0_4_ * 0.00012207031;
            local_960._4_4_ =
                 auVar62._4_4_ * auVar57._4_4_ * 0.00012207031 +
                 auVar59._4_4_ * auVar61._4_4_ * 0.00012207031 +
                 auVar49._4_4_ * auVar60._4_4_ * 0.00012207031;
            local_960._8_4_ =
                 auVar62._8_4_ * auVar57._8_4_ * 0.00012207031 +
                 auVar59._8_4_ * auVar61._8_4_ * 0.00012207031 +
                 auVar49._8_4_ * auVar60._8_4_ * 0.00012207031;
            local_960._12_4_ =
                 auVar62._12_4_ * auVar57._12_4_ * 0.00012207031 +
                 auVar59._12_4_ * auVar61._12_4_ * 0.00012207031 +
                 auVar49._12_4_ * auVar60._12_4_ * 0.00012207031;
            local_960._16_4_ =
                 auVar62._16_4_ * auVar57._16_4_ * 0.00012207031 +
                 auVar59._16_4_ * auVar61._16_4_ * 0.00012207031 +
                 auVar49._16_4_ * auVar60._16_4_ * 0.00012207031;
            local_960._20_4_ =
                 auVar62._20_4_ * auVar57._20_4_ * 0.00012207031 +
                 auVar59._20_4_ * auVar61._20_4_ * 0.00012207031 +
                 auVar49._20_4_ * auVar60._20_4_ * 0.00012207031;
            local_960._24_4_ =
                 auVar62._24_4_ * auVar57._24_4_ * 0.00012207031 +
                 auVar59._24_4_ * auVar61._24_4_ * 0.00012207031 +
                 auVar49._24_4_ * auVar60._24_4_ * 0.00012207031;
            local_960._28_4_ = auVar57._28_4_ + auVar61._28_4_ + auVar62._28_4_;
            local_940._0_4_ =
                 auVar62._0_4_ * auVar64._0_4_ * 0.00012207031 +
                 auVar59._0_4_ * auVar63._0_4_ * 0.00012207031 +
                 auVar49._0_4_ * auVar69._0_4_ * 0.00012207031;
            local_940._4_4_ =
                 auVar62._4_4_ * auVar64._4_4_ * 0.00012207031 +
                 auVar59._4_4_ * auVar63._4_4_ * 0.00012207031 +
                 auVar49._4_4_ * auVar69._4_4_ * 0.00012207031;
            local_940._8_4_ =
                 auVar62._8_4_ * auVar64._8_4_ * 0.00012207031 +
                 auVar59._8_4_ * auVar63._8_4_ * 0.00012207031 +
                 auVar49._8_4_ * auVar69._8_4_ * 0.00012207031;
            local_940._12_4_ =
                 auVar62._12_4_ * auVar64._12_4_ * 0.00012207031 +
                 auVar59._12_4_ * auVar63._12_4_ * 0.00012207031 +
                 auVar49._12_4_ * auVar69._12_4_ * 0.00012207031;
            local_940._16_4_ =
                 auVar62._16_4_ * auVar64._16_4_ * 0.00012207031 +
                 auVar59._16_4_ * auVar63._16_4_ * 0.00012207031 +
                 auVar49._16_4_ * auVar69._16_4_ * 0.00012207031;
            local_940._20_4_ =
                 auVar62._20_4_ * auVar64._20_4_ * 0.00012207031 +
                 auVar59._20_4_ * auVar63._20_4_ * 0.00012207031 +
                 auVar49._20_4_ * auVar69._20_4_ * 0.00012207031;
            local_940._24_4_ =
                 auVar62._24_4_ * auVar64._24_4_ * 0.00012207031 +
                 auVar59._24_4_ * auVar63._24_4_ * 0.00012207031 +
                 auVar49._24_4_ * auVar69._24_4_ * 0.00012207031;
            local_940._28_4_ = auVar61._28_4_ + auVar63._28_4_ + auVar49._28_4_;
            uVar31 = (ulong)local_978;
            bVar36 = uVar31 != 0;
            if (bVar36) {
              uVar29 = 0;
              for (uVar26 = uVar31; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                uVar29 = uVar29 + 1;
              }
              local_a00 = vpbroadcastd_avx512vl();
              local_a10 = vpbroadcastd_avx512vl();
              do {
                uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
                uVar8 = *(undefined4 *)(local_960 + uVar29 * 4);
                local_860._4_4_ = uVar8;
                local_860._0_4_ = uVar8;
                local_860._8_4_ = uVar8;
                local_860._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_940 + uVar29 * 4);
                local_850._4_4_ = uVar8;
                local_850._0_4_ = uVar8;
                local_850._8_4_ = uVar8;
                local_850._12_4_ = uVar8;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_920 + uVar29 * 4);
                local_a40.context = context->user;
                local_890 = *(undefined4 *)(local_900 + uVar29 * 4);
                uVar8 = *(undefined4 *)(local_8e0 + uVar29 * 4);
                local_880._4_4_ = uVar8;
                local_880._0_4_ = uVar8;
                local_880._8_4_ = uVar8;
                local_880._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_8c0 + uVar29 * 4);
                local_870._4_4_ = uVar8;
                local_870._0_4_ = uVar8;
                local_870._8_4_ = uVar8;
                local_870._12_4_ = uVar8;
                uStack_88c = local_890;
                uStack_888 = local_890;
                uStack_884 = local_890;
                local_840 = local_a10._0_8_;
                uStack_838 = local_a10._8_8_;
                local_830 = local_a00;
                vpcmpeqd_avx2(ZEXT1632(local_a00),ZEXT1632(local_a00));
                uStack_81c = (local_a40.context)->instID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = (local_a40.context)->instPrimID[0];
                uStack_80c = uStack_810;
                uStack_808 = uStack_810;
                uStack_804 = uStack_810;
                local_ae0 = local_9f0._0_8_;
                uStack_ad8 = local_9f0._8_8_;
                local_a40.valid = (int *)&local_ae0;
                local_a40.geometryUserPtr = pGVar16->userPtr;
                local_a40.hit = (RTCHitN *)&local_890;
                local_a40.N = 4;
                local_a40.ray = (RTCRayN *)ray;
                if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar16->occlusionFilterN)(&local_a40);
                }
                auVar42._8_8_ = uStack_ad8;
                auVar42._0_8_ = local_ae0;
                uVar26 = vptestmd_avx512vl(auVar42,auVar42);
                if ((uVar26 & 0xf) != 0) {
                  p_Var17 = context->args->filter;
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var17)(&local_a40);
                  }
                  auVar43._8_8_ = uStack_ad8;
                  auVar43._0_8_ = local_ae0;
                  uVar26 = vptestmd_avx512vl(auVar43,auVar43);
                  uVar26 = uVar26 & 0xf;
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar18 = (bool)((byte)uVar26 & 1);
                  auVar44._0_4_ =
                       (uint)bVar18 * auVar38._0_4_ | (uint)!bVar18 * *(int *)(local_a40.ray + 0x80)
                  ;
                  bVar18 = (bool)((byte)(uVar26 >> 1) & 1);
                  auVar44._4_4_ =
                       (uint)bVar18 * auVar38._4_4_ | (uint)!bVar18 * *(int *)(local_a40.ray + 0x84)
                  ;
                  bVar18 = (bool)((byte)(uVar26 >> 2) & 1);
                  auVar44._8_4_ =
                       (uint)bVar18 * auVar38._8_4_ | (uint)!bVar18 * *(int *)(local_a40.ray + 0x88)
                  ;
                  bVar18 = SUB81(uVar26 >> 3,0);
                  auVar44._12_4_ =
                       (uint)bVar18 * auVar38._12_4_ |
                       (uint)!bVar18 * *(int *)(local_a40.ray + 0x8c);
                  *(undefined1 (*) [16])(local_a40.ray + 0x80) = auVar44;
                  if ((byte)uVar26 != 0) {
                    auVar85 = ZEXT1664(local_a50);
                    auVar86 = ZEXT1664(local_a60);
                    auVar87 = ZEXT1664(local_a70);
                    auVar88 = ZEXT1664(local_a80);
                    auVar89 = ZEXT1664(local_a90);
                    auVar90 = ZEXT1664(local_aa0);
                    break;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar7;
                uVar26 = uVar29 & 0x3f;
                uVar29 = 0;
                uVar31 = uVar31 ^ 1L << uVar26;
                for (uVar26 = uVar31; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
                {
                  uVar29 = uVar29 + 1;
                }
                bVar36 = uVar31 != 0;
                auVar85 = ZEXT1664(local_a50);
                auVar86 = ZEXT1664(local_a60);
                auVar87 = ZEXT1664(local_a70);
                auVar88 = ZEXT1664(local_a80);
                auVar89 = ZEXT1664(local_a90);
                auVar90 = ZEXT1664(local_aa0);
              } while (bVar36);
            }
          }
        }
        uVar26 = 0;
        uVar31 = local_ad0;
      }
      else {
        uVar26 = *(ulong *)*(GridSOA **)(uVar29 & 0xfffffffffffffff0);
        (pre->super_Precalculations).grid = *(GridSOA **)(uVar29 & 0xfffffffffffffff0);
        bVar36 = false;
      }
      if (bVar36) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar73 = 1;
      }
      else {
        uVar73 = 0;
        if (uVar26 != 0) {
          *local_ac8 = uVar26;
          local_ac8 = local_ac8 + 1;
        }
      }
    }
    puVar25 = local_ac8;
  } while ((uVar73 & 3) == 0);
  return local_ac0 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }